

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O1

int xmlNanoFTPCheckResponse(void *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  fd_set rfd;
  timeval local_a8;
  fd_set local_98;
  
  iVar3 = -1;
  iVar2 = iVar3;
  if ((ctx != (void *)0x0) && (iVar1 = *(int *)((long)ctx + 0x44), iVar1 != -1)) {
    local_a8.tv_sec = 0;
    local_a8.tv_usec = 0;
    local_98.fds_bits[0] = 0;
    local_98.fds_bits[1] = 0;
    local_98.fds_bits[2] = 0;
    local_98.fds_bits[3] = 0;
    local_98.fds_bits[4] = 0;
    local_98.fds_bits[5] = 0;
    local_98.fds_bits[6] = 0;
    local_98.fds_bits[7] = 0;
    local_98.fds_bits[8] = 0;
    local_98.fds_bits[9] = 0;
    local_98.fds_bits[10] = 0;
    local_98.fds_bits[0xb] = 0;
    iVar2 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    local_98.fds_bits[0xc] = 0;
    local_98.fds_bits[0xd] = 0;
    local_98.fds_bits[0xe] = 0;
    local_98.fds_bits[0xf] = 0;
    local_98.fds_bits[iVar2 >> 6] =
         local_98.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar1 % 0x40) & 0x3f);
    iVar2 = select(iVar1 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
    if (iVar2 != 0) {
      if (iVar2 == -1) {
        __xmlIOErr(9,0,"select");
        iVar2 = iVar3;
      }
      else {
        iVar2 = xmlNanoFTPReadResponse(ctx);
      }
    }
  }
  return iVar2;
}

Assistant:

int
xmlNanoFTPCheckResponse(void *ctx) {
    xmlNanoFTPCtxtPtr ctxt = (xmlNanoFTPCtxtPtr) ctx;
    fd_set rfd;
    struct timeval tv;

    if ((ctxt == NULL) || (ctxt->controlFd == INVALID_SOCKET)) return(-1);
    tv.tv_sec = 0;
    tv.tv_usec = 0;
    FD_ZERO(&rfd);
    FD_SET(ctxt->controlFd, &rfd);
    switch(select(ctxt->controlFd + 1, &rfd, NULL, NULL, &tv)) {
	case 0:
	    return(0);
	case -1:
	    __xmlIOErr(XML_FROM_FTP, 0, "select");
	    return(-1);

    }

    return(xmlNanoFTPReadResponse(ctx));
}